

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocTestApprovals.h
# Opt level: O1

void __thiscall
ApprovalTests::anon_unknown_1::DocTestApprovalListener::subcase_start
          (DocTestApprovalListener *this,SubcaseSignature *signature)

{
  allocator local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((signature->m_name).field_0.buf[0x17] < '\0') {
    signature = (SubcaseSignature *)(signature->m_name).field_0.data.ptr;
  }
  ::std::__cxx11::string::string((string *)&local_30,(char *)signature,&local_31);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->currentTest
             ,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void subcase_start(const doctest::SubcaseSignature& signature) override
            {
                currentTest.sections.emplace_back(doctestToString(signature.m_name));
            }